

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_PlaneSurface::Transpose(ON_PlaneSurface *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ON_Interval i;
  
  ON_Plane::Flip(&this->m_plane);
  uVar1 = *(undefined8 *)&this->field_0x90;
  uVar2 = *(undefined8 *)&this->field_0x98;
  uVar3 = *(undefined8 *)&this->field_0xb0;
  uVar4 = *(undefined8 *)&this->field_0xb8;
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)&this->field_0xa0;
  *(undefined8 *)&this->field_0x98 = *(undefined8 *)&this->field_0xa8;
  *(undefined8 *)&this->field_0xa0 = uVar1;
  *(undefined8 *)&this->field_0xa8 = uVar2;
  *(undefined8 *)&this->field_0xb0 = *(undefined8 *)&this->field_0xc0;
  *(undefined8 *)&this->field_0xb8 = *(undefined8 *)&this->field_0xc8;
  *(undefined8 *)&this->field_0xc0 = uVar3;
  *(undefined8 *)&this->field_0xc8 = uVar4;
  return true;
}

Assistant:

bool
ON_PlaneSurface::Transpose()
{
  // swaps x and y axes and reverses zaxis
  m_plane.Flip();

  ON_Interval i = m_domain[0];
  m_domain[0] = m_domain[1];
  m_domain[1] = i;

  i = m_extents[0];
  m_extents[0] = m_extents[1];
  m_extents[1] = i;

  return true;
}